

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int start_openssh_server(char **container_id_out)

{
  char *pcVar1;
  char *container_host_port;
  char **container_id_out_local;
  
  if (have_docker == 0) {
    pcVar1 = strdup("");
    *container_id_out = pcVar1;
    container_id_out_local._4_4_ = 0;
  }
  else {
    pcVar1 = openssh_server_port();
    if (pcVar1 == (char *)0x0) {
      container_id_out_local._4_4_ =
           run_command(container_id_out,"docker run --rm -d -p 22 libssh2/openssh_server");
    }
    else {
      container_id_out_local._4_4_ =
           run_command(container_id_out,"docker run --rm -d -p %s:22 libssh2/openssh_server",pcVar1)
      ;
    }
  }
  return container_id_out_local._4_4_;
}

Assistant:

static int start_openssh_server(char **container_id_out)
{
    if(have_docker) {
        const char *container_host_port = openssh_server_port();
        if(container_host_port) {
            return run_command(container_id_out,
                               "docker run --rm -d -p %s:22 "
                               "libssh2/openssh_server",
                               container_host_port);
        }

        return run_command(container_id_out,
                           "docker run --rm -d -p 22 "
                           "libssh2/openssh_server");
    }
    else {
        *container_id_out = strdup("");
        return 0;
    }
}